

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.h
# Opt level: O2

string * print_current_time_abi_cxx11_(void)

{
  tm *ptVar1;
  ostream *poVar2;
  string *in_RDI;
  allocator local_96;
  allocator local_95;
  Logger local_94;
  time_t current_time;
  string local_88;
  string local_68;
  tm broken_down_time;
  
  current_time = time((time_t *)0x0);
  ptVar1 = localtime_r(&current_time,(tm *)&broken_down_time);
  if (ptVar1 == (tm *)&broken_down_time) {
    StringPrintf_abi_cxx11_
              (in_RDI,"%04d%02d%02d-%02d%02d%02d",(ulong)(broken_down_time.tm_year + 0x76c),
               (ulong)(broken_down_time.tm_mon + 1),(ulong)(uint)broken_down_time.tm_mday,
               (ulong)(uint)broken_down_time.tm_hour,(ulong)(uint)broken_down_time.tm_min,
               (ulong)(uint)broken_down_time.tm_sec);
    return in_RDI;
  }
  local_94.severity_ = ERR;
  std::__cxx11::string::string
            ((string *)&local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/system.h"
             ,&local_95);
  std::__cxx11::string::string((string *)&local_88,"print_current_time",&local_96);
  poVar2 = Logger::Start(ERR,&local_68,0x3a,&local_88);
  poVar2 = std::operator<<(poVar2,"CHECK failed ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/system.h"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x3a);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,
                           "localtime_r(&current_time, &broken_down_time) == &broken_down_time");
  poVar2 = std::operator<<(poVar2," = ");
  localtime_r(&current_time,(tm *)&broken_down_time);
  poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  Logger::~Logger(&local_94);
  abort();
}

Assistant:

std::string print_current_time() {
  time_t current_time = time(NULL);
  struct tm broken_down_time;
#ifndef _MSC_VER
  CHECK(localtime_r(&current_time, &broken_down_time) == &broken_down_time);
#else
  CHECK(localtime_s(&broken_down_time, &current_time) == 0);
#endif
  return StringPrintf("%04d%02d%02d-%02d%02d%02d",
                      1900 + broken_down_time.tm_year,
                      1 + broken_down_time.tm_mon,
                      broken_down_time.tm_mday,
                      broken_down_time.tm_hour,
                      broken_down_time.tm_min,
                      broken_down_time.tm_sec);
}